

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcResub.c
# Opt level: O2

Dec_Graph_t * Abc_ManResubQuit1(Abc_Obj_t *pRoot,Abc_Obj_t *pObj0,Abc_Obj_t *pObj1,int fOrGate)

{
  Dec_Node_t *pDVar1;
  Dec_Graph_t *pGraph;
  Dec_Edge_t DVar2;
  Dec_Edge_t eEdge0;
  
  if (pObj0 == pObj1) {
    __assert_fail("pObj0 != pObj1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcResub.c"
                  ,0x28d,
                  "Dec_Graph_t *Abc_ManResubQuit1(Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *, int)");
  }
  if (((ulong)pObj0 & 1) == 0) {
    if (((ulong)pObj1 & 1) == 0) {
      pGraph = Dec_GraphCreate(2);
      pDVar1 = pGraph->pNodes;
      (pDVar1->field_2).pFunc = pObj0;
      pDVar1[1].field_2.pFunc = pObj1;
      eEdge0 = (Dec_Edge_t)(*(uint *)&pObj0->field_0x14 >> 7 & 1);
      DVar2 = (Dec_Edge_t)(*(uint *)&pObj1->field_0x14 >> 7 & 1 | 2);
      if (fOrGate == 0) {
        DVar2 = Dec_GraphAddNodeAnd(pGraph,eEdge0,DVar2);
      }
      else {
        DVar2 = Dec_GraphAddNodeOr(pGraph,eEdge0,DVar2);
      }
      pGraph->eRoot = DVar2;
      if ((pRoot->field_0x14 & 0x80) != 0) {
        pGraph->eRoot = (Dec_Edge_t)((uint)DVar2 ^ 1);
      }
      return pGraph;
    }
    __assert_fail("!Abc_ObjIsComplement(pObj1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcResub.c"
                  ,0x28f,
                  "Dec_Graph_t *Abc_ManResubQuit1(Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *, int)");
  }
  __assert_fail("!Abc_ObjIsComplement(pObj0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcResub.c"
                ,0x28e,"Dec_Graph_t *Abc_ManResubQuit1(Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *, int)")
  ;
}

Assistant:

Dec_Graph_t * Abc_ManResubQuit1( Abc_Obj_t * pRoot, Abc_Obj_t * pObj0, Abc_Obj_t * pObj1, int fOrGate )
{
    Dec_Graph_t * pGraph;
    Dec_Edge_t eRoot, eNode0, eNode1;
    assert( pObj0 != pObj1 );
    assert( !Abc_ObjIsComplement(pObj0) );
    assert( !Abc_ObjIsComplement(pObj1) );
    pGraph = Dec_GraphCreate( 2 );
    Dec_GraphNode( pGraph, 0 )->pFunc = pObj0;
    Dec_GraphNode( pGraph, 1 )->pFunc = pObj1;
    eNode0 = Dec_EdgeCreate( 0, pObj0->fPhase );
    eNode1 = Dec_EdgeCreate( 1, pObj1->fPhase );
    if ( fOrGate ) 
        eRoot  = Dec_GraphAddNodeOr( pGraph, eNode0, eNode1 );
    else
        eRoot  = Dec_GraphAddNodeAnd( pGraph, eNode0, eNode1 );
    Dec_GraphSetRoot( pGraph, eRoot );
    if ( pRoot->fPhase )
        Dec_GraphComplement( pGraph );
    return pGraph;
}